

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ChargeStrengthSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ChargeStrengthSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Token strength;
  Token openParen;
  ChargeStrengthSyntax *pCVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Token *in_RSI;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pCVar1 = (ChargeStrengthSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  openParen.info = (Info *)*in_RDX;
  openParen._0_8_ = (ChargeStrengthSyntax *)in_RCX[1];
  strength.info = (Info *)*in_RCX;
  strength._0_8_ = pCVar1;
  slang::syntax::ChargeStrengthSyntax::ChargeStrengthSyntax
            ((ChargeStrengthSyntax *)in_RCX[1],openParen,strength,*in_RSI);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }